

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
int_writer<unsigned_int,_fmt::v5::basic_format_specs<wchar_t>_>::on_hex
          (int_writer<unsigned_int,_fmt::v5::basic_format_specs<wchar_t>_> *this)

{
  basic_format_specs<wchar_t> *pbVar1;
  hex_writer f;
  wchar_t wVar2;
  uint uVar3;
  string_view prefix;
  undefined4 uStack_c;
  
  pbVar1 = this->spec;
  if ((pbVar1->flags_ & 8) != 0) {
    uVar3 = this->prefix_size;
    this->prefix_size = uVar3 + 1;
    this->prefix[uVar3] = '0';
    wVar2 = pbVar1->type_;
    uVar3 = this->prefix_size;
    this->prefix_size = uVar3 + 1;
    this->prefix[uVar3] = (char)wVar2;
  }
  uVar3 = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
          int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::count_digits<4u>(this);
  f._12_4_ = uStack_c;
  f.num_digits = uVar3;
  f.self = this;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
  write_int<fmt::v5::basic_format_specs<wchar_t>,fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::hex_writer>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *)
             this->writer,uVar3,prefix,this->spec,f);
  return;
}

Assistant:

void on_hex() {
      if (spec.flag(HASH_FLAG)) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(spec.type());
      }
      unsigned num_digits = count_digits<4>();
      writer.write_int(num_digits, get_prefix(), spec,
                       hex_writer{*this, num_digits});
    }